

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O2

void Io_NtkWriteNets(FILE *pFile,Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  ProgressBar *p;
  char *pcVar7;
  char *pcVar8;
  char *pString;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    uVar9 = 0;
    for (iVar11 = 0; iVar11 < pNtk->vObjs->nSize; iVar11 = iVar11 + 1) {
      pAVar6 = Abc_NtkObj(pNtk,iVar11);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 6)) {
        uVar9 = uVar9 + (pAVar6->vFanins).nSize + (pAVar6->vFanouts).nSize;
      }
    }
    printf("NumNets  : %d\t",(ulong)(uint)pNtk->nObjCounts[6]);
    printf("NumPins      : %d\n\n",(ulong)uVar9);
    fwrite("UCLA    nets    1.0\n",0x14,1,(FILE *)pFile);
    fprintf((FILE *)pFile,"NumNets : %d\n",(ulong)(uint)pNtk->nObjCounts[6]);
    fprintf((FILE *)pFile,"NumPins : %d\n",(ulong)uVar9);
    p = Extra_ProgressBarStart(_stdout,pNtk->nObjCounts[6]);
    for (iVar11 = 0; iVar11 < pNtk->vObjs->nSize; iVar11 = iVar11 + 1) {
      pAVar6 = Abc_NtkObj(pNtk,iVar11);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 6)) {
        Extra_ProgressBarUpdate(p,iVar11,pString);
        iVar1 = (pAVar6->vFanouts).nSize;
        iVar2 = (pAVar6->vFanins).nSize;
        pcVar7 = Abc_ObjName((Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray]);
        fprintf((FILE *)pFile,"NetDegree\t:\t\t%d\t\t%s\n",(ulong)(uint)(iVar1 + iVar2),pcVar7);
        plVar3 = (long *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
        if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 2) {
          pcVar7 = Abc_ObjName(pAVar6);
          fprintf((FILE *)pFile,"i%s_input I\n",pcVar7);
        }
        else {
          if (((pAVar6->pNtk->nObjCounts[8] == 0) || (*(int *)((long)plVar3 + 0x1c) == 0)) ||
             (plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                 (long)*(int *)plVar3[4] * 8),
             (*(uint *)((long)plVar4 + 0x14) & 0xf) != 8)) {
            for (lVar12 = 0; lVar12 < *(int *)((long)plVar3 + 0x1c); lVar12 = lVar12 + 1) {
              pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)(plVar3[4] + lVar12 * 4) * 8));
              fprintf((FILE *)pFile,"%s_",pcVar7);
            }
            for (lVar12 = 0; lVar12 < *(int *)((long)plVar3 + 0x2c); lVar12 = lVar12 + 1) {
              pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)(plVar3[6] + lVar12 * 4) * 8));
              fprintf((FILE *)pFile,"%s_",pcVar7);
            }
            if (pAVar6->pNtk->ntkFunc == ABC_FUNC_MAP) {
              pcVar7 = Mio_GateReadName((Mio_Gate_t *)plVar3[7]);
              fprintf((FILE *)pFile,"%s : ",pcVar7);
            }
            else {
              fwrite("name I : ",9,1,(FILE *)pFile);
            }
          }
          else {
            lVar12 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
            plVar3 = *(long **)(lVar12 + (long)*(int *)plVar4[4] * 8);
            plVar4 = *(long **)(lVar12 + (long)*(int *)plVar4[6] * 8);
            pAVar5 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8);
            pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                  (long)*(int *)plVar3[4] * 8));
            pcVar8 = Abc_ObjName(pAVar5);
            fprintf((FILE *)pFile,"%s_%s_latch I : ",pcVar7,pcVar8);
          }
          fprintf((FILE *)pFile,"%.2f %.2f\n",0,0);
        }
        for (lVar12 = 0; lVar12 < (pAVar6->vFanouts).nSize; lVar12 = lVar12 + 1) {
          plVar3 = (long *)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanouts).pArray[lVar12]];
          if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 3) {
            pcVar7 = Abc_ObjName(pAVar6);
            fprintf((FILE *)pFile,"o%s_output O\n",pcVar7);
          }
          else {
            if (((pAVar6->pNtk->nObjCounts[8] == 0) || (*(int *)((long)plVar3 + 0x2c) == 0)) ||
               (plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                   (long)*(int *)plVar3[6] * 8),
               (*(uint *)((long)plVar4 + 0x14) & 0xf) != 8)) {
              for (lVar10 = 0; lVar10 < *(int *)((long)plVar3 + 0x1c); lVar10 = lVar10 + 1) {
                pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                                      (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                      (long)*(int *)(plVar3[4] + lVar10 * 4) * 8));
                fprintf((FILE *)pFile,"%s_",pcVar7);
              }
              for (lVar10 = 0; lVar10 < *(int *)((long)plVar3 + 0x2c); lVar10 = lVar10 + 1) {
                pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                                      (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                      (long)*(int *)(plVar3[6] + lVar10 * 4) * 8));
                fprintf((FILE *)pFile,"%s_",pcVar7);
              }
              if (pAVar6->pNtk->ntkFunc == ABC_FUNC_MAP) {
                pcVar7 = Mio_GateReadName((Mio_Gate_t *)plVar3[7]);
                fprintf((FILE *)pFile,"%s : ",pcVar7);
              }
              else {
                fwrite("name O : ",9,1,(FILE *)pFile);
              }
            }
            else {
              lVar10 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
              plVar3 = *(long **)(lVar10 + (long)*(int *)plVar4[4] * 8);
              plVar4 = *(long **)(lVar10 + (long)*(int *)plVar4[6] * 8);
              pAVar5 = *(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8);
              pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[4] * 8));
              pcVar8 = Abc_ObjName(pAVar5);
              fprintf((FILE *)pFile,"%s_%s_latch O : ",pcVar7,pcVar8);
            }
            fprintf((FILE *)pFile,"%.2f %.2f\n",0,0);
          }
        }
      }
    }
    Extra_ProgressBarStop(p);
    return;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                ,0x19a,"void Io_NtkWriteNets(FILE *, Abc_Ntk_t *)");
}

Assistant:

void Io_NtkWriteNets( FILE * pFile, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNet;
    unsigned numPin=0;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    // write the head
    Abc_NtkForEachNet( pNtk, pNet, i )
    numPin+=Abc_ObjFaninNum(pNet)+Abc_ObjFanoutNum(pNet);
    printf( "NumNets  : %d\t", Abc_NtkNetNum(pNtk) );
    printf( "NumPins      : %d\n\n", numPin );
    fprintf( pFile, "UCLA    nets    1.0\n");
    fprintf( pFile, "NumNets : %d\n", Abc_NtkNetNum(pNtk) );
    fprintf( pFile, "NumPins : %d\n", numPin );

    // write nets
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNetNum(pNtk) );
    Abc_NtkForEachNet( pNtk, pNet, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        Io_NtkWriteIntNet( pFile, pNet );
    }
    Extra_ProgressBarStop( pProgress );
}